

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_errormsg(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  undefined4 uVar3;
  Value *pVVar4;
  TValue *io1_1;
  TValue *io1;
  StkId errfunc;
  lua_State *L_local;
  
  if (L->errfunc != 0) {
    pVVar4 = (Value *)((long)&L->stack->value_ + L->errfunc);
    pTVar1 = L->top;
    pTVar2 = L->top;
    pTVar1->value_ = pTVar2[-1].value_;
    uVar3 = *(undefined4 *)&pTVar2[-1].field_0xc;
    pTVar1->tt_ = pTVar2[-1].tt_;
    *(undefined4 *)&pTVar1->field_0xc = uVar3;
    pTVar1 = L->top;
    pTVar1[-1].value_ = *pVVar4;
    *(Value *)&pTVar1[-1].tt_ = pVVar4[1];
    L->top = L->top + 1;
    luaD_callnoyield(L,L->top + -2,1);
  }
  luaD_throw(L,2);
}

Assistant:

l_noret luaG_errormsg(lua_State *L) {
    if (L->errfunc != 0) {  /* is there an error handling function? */
        StkId errfunc = restorestack(L, L->errfunc);
        setobjs2s(L, L->top, L->top - 1);  /* move argument */
        setobjs2s(L, L->top - 1, errfunc);  /* push function */
        L->top++;  /* assume EXTRA_STACK */
        luaD_callnoyield(L, L->top - 2, 1);  /* call it */
    }
    luaD_throw(L, LUA_ERRRUN);
}